

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::anon_unknown_32::FailureTest::TestBody(FailureTest *this)

{
  ostream *this_00;
  char *in_RDI;
  Message *in_stack_00000038;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  AssertHelper *this_01;
  int in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  Type in_stack_ffffffffffffffec;
  AssertHelper in_stack_fffffffffffffff0;
  
  if ((in_RDI[0x58] & 1U) == 0) {
    this_00 = std::operator<<((ostream *)&std::cout,(string *)(in_RDI + 0x38));
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    this_01 = (AssertHelper *)&stack0xfffffffffffffff0;
    Message::Message((Message *)in_stack_fffffffffffffff0.data_);
    Message::operator<<((Message *)this_01,in_stack_ffffffffffffffb8);
    std::__cxx11::string::c_str();
    AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffff0.data_,in_stack_ffffffffffffffec,
               in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_RDI);
    AssertHelper::operator=((AssertHelper *)this,in_stack_00000038);
    AssertHelper::~AssertHelper(this_01);
    Message::~Message((Message *)0x14549c);
  }
  return;
}

Assistant:

void TestBody() override {
    if (as_error_) {
      AssertHelper(TestPartResult::kNonFatalFailure, loc_.file.c_str(),
                   loc_.line, "") = Message() << error_message_;
    } else {
      std::cout << error_message_ << std::endl;
    }
  }